

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O0

void __thiscall
std::experimental::optional_base<std::weak_ptr<SyntaxTree>_>::~optional_base
          (optional_base<std::weak_ptr<SyntaxTree>_> *this)

{
  optional_base<std::weak_ptr<SyntaxTree>_> *this_local;
  
  if ((this->init_ & 1U) != 0) {
    weak_ptr<SyntaxTree>::~weak_ptr(&(this->storage_).value_);
  }
  storage_t<std::weak_ptr<SyntaxTree>_>::~storage_t
            ((storage_t<std::weak_ptr<SyntaxTree>_> *)&(this->storage_).value_);
  return;
}

Assistant:

~optional_base() { if (init_) storage_.value_.T::~T(); }